

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_LotsOfFlags_Test::~TApp_LotsOfFlags_Test(TApp_LotsOfFlags_Test *this)

{
  TApp_LotsOfFlags_Test *this_local;
  
  ~TApp_LotsOfFlags_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, LotsOfFlags) {

    app.add_flag("-a");
    app.add_flag("-A");
    app.add_flag("-b");

    args = {"-a", "-b", "-aA"};
    run();
    EXPECT_EQ((size_t)2, app.count("-a"));
    EXPECT_EQ((size_t)1, app.count("-b"));
    EXPECT_EQ((size_t)1, app.count("-A"));
}